

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O2

void __thiscall restincurl::Worker::Join(Worker *this)

{
  element_type *peVar1;
  shared_ptr<restincurl::Worker::WorkerThread> thd;
  __shared_ptr<restincurl::Worker::WorkerThread,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  local_28._M_ptr = (WorkerThread *)0x0;
  local_28._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::mutex::lock(&this->mutex_);
  peVar1 = (this->thread_).
           super___shared_ptr<restincurl::Worker::WorkerThread,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar1 != (element_type *)0x0) && ((peVar1->thread_)._M_id._M_thread != 0)) {
    std::__shared_ptr<restincurl::Worker::WorkerThread,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_28,
               &(this->thread_).
                super___shared_ptr<restincurl::Worker::WorkerThread,_(__gnu_cxx::_Lock_policy)2>);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  if (local_28._M_ptr != (WorkerThread *)0x0) {
    WorkerThread::Join(local_28._M_ptr);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  return;
}

Assistant:

void Join() const {
            decltype(thread_) thd;

            {
                lock_t lock(mutex_);
                if (thread_ && thread_->Joinable()) {
                    thd = thread_;
                }
            }

            if (thd) {
                thd->Join();
            }
        }